

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_RevSurface::IsClosed(ON_RevSurface *this,int dir)

{
  int iVar1;
  double dVar2;
  bool local_15;
  uint local_14;
  bool rc;
  int dir_local;
  ON_RevSurface *this_local;
  
  local_15 = false;
  local_14 = dir;
  if ((this->m_bTransposed & 1U) != 0) {
    local_14 = (uint)(dir == 0);
  }
  if (local_14 == 0) {
    dVar2 = ON_Interval::Length(&this->m_angle);
    local_15 = 6.283185306946756 <= dVar2;
  }
  else if ((local_14 == 1) && (this->m_curve != (ON_Curve *)0x0)) {
    iVar1 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
    local_15 = (bool)((byte)iVar1 & 1);
  }
  return local_15;
}

Assistant:

bool ON_RevSurface::IsClosed( int dir ) const  // dir  0 = "s", 1 = "t"
{
  bool rc = false;
  if ( m_bTransposed )
    dir = dir ? 0 : 1;
  if ( dir == 0 )
  {
    if (m_angle.Length() >= 2.0*ON_PI-ON_ZERO_TOLERANCE )
      rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->IsClosed();
  }
  return rc;
}